

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

void __thiscall
QXmlStreamPrivateTagStack::QXmlStreamPrivateTagStack(QXmlStreamPrivateTagStack *this)

{
  QString *this_00;
  ArrayOptions *pAVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  long lVar4;
  Tag *pTVar5;
  long lVar6;
  NamespaceDeclaration *pNVar7;
  long lVar8;
  qsizetype alloc;
  long in_FS_OFFSET;
  QAnyStringView s;
  QAnyStringView s_00;
  XmlStringRef local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->namespaceDeclarations).data = (NamespaceDeclaration *)0x0;
  (this->namespaceDeclarations).tos = -1;
  this_00 = &this->tagStackStringStorage;
  (this->tagStack).data = (Tag *)0x0;
  (this->namespaceDeclarations).cap = 0;
  (this->tagStackStringStorage).d.d = (Data *)0x0;
  (this->tagStackStringStorage).d.ptr = (char16_t *)0x0;
  (this->tagStackStringStorage).d.size = 0;
  (this->tagStack).tos = -1;
  (this->tagStack).cap = 0x10;
  pTVar5 = (Tag *)malloc(0x700);
  (this->tagStack).data = pTVar5;
  if (pTVar5 == (Tag *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      qBadAlloc();
    }
  }
  else {
    pDVar3 = (this_00->d).d;
    if (((pDVar3 == (Data *)0x0) ||
        (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
       ((pDVar3->super_QArrayData).alloc -
        ((long)((long)(this->tagStackStringStorage).d.ptr -
               ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 1) <
        0x21)) {
      lVar8 = (this->tagStackStringStorage).d.size;
      alloc = 0x20;
      if (0x20 < lVar8) {
        alloc = lVar8;
      }
      QString::reallocData(this_00,alloc,KeepSize);
    }
    pDVar3 = (this_00->d).d;
    if ((pDVar3 != (Data *)0x0) && ((pDVar3->super_QArrayData).alloc != 0)) {
      pAVar1 = &(pDVar3->super_QArrayData).flags;
      *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                super_QFlagsStorage<QArrayData::ArrayOption>.i =
           (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
                 super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
    }
    this->tagStackStringStorageSize = 0;
    lVar8 = (this->namespaceDeclarations).tos;
    lVar4 = (this->namespaceDeclarations).cap;
    if (lVar4 <= lVar8 + 1) {
      lVar8 = lVar8 + 2;
      lVar6 = lVar4 * 2;
      if (lVar8 != lVar6 && SBORROW8(lVar8,lVar6) == lVar8 + lVar4 * -2 < 0) {
        lVar6 = lVar8;
      }
      (this->namespaceDeclarations).cap = lVar6;
      pNVar7 = (NamespaceDeclaration *)realloc((this->namespaceDeclarations).data,lVar6 * 0x30);
      (this->namespaceDeclarations).data = pNVar7;
      if (pNVar7 == (NamespaceDeclaration *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          qBadAlloc();
        }
        goto LAB_003a0711;
      }
    }
    pNVar7 = (this->namespaceDeclarations).data;
    lVar8 = (this->namespaceDeclarations).tos + 1;
    (this->namespaceDeclarations).tos = lVar8;
    pqVar2 = &pNVar7[lVar8].namespaceUri.m_pos;
    *pqVar2 = 0;
    pqVar2[1] = 0;
    pqVar2 = &pNVar7[lVar8].prefix.m_size;
    *pqVar2 = 0;
    pqVar2[1] = 0;
    pNVar7[lVar8].prefix.m_string = (QString *)0x0;
    pNVar7[lVar8].prefix.m_pos = 0;
    s.m_size = 0x8000000000000003;
    s.field_0.m_data_utf16 = L"xml";
    addToStringStorage(&local_40,this,s);
    pNVar7 = pNVar7 + lVar8;
    (pNVar7->prefix).m_size = local_40.m_size;
    (pNVar7->prefix).m_string = local_40.m_string;
    (pNVar7->prefix).m_pos = local_40.m_pos;
    s_00.m_size = 0x8000000000000024;
    s_00.field_0.m_data_utf16 = L"http://www.w3.org/XML/1998/namespace";
    addToStringStorage(&local_40,this,s_00);
    (pNVar7->namespaceUri).m_size = local_40.m_size;
    (pNVar7->namespaceUri).m_string = local_40.m_string;
    (pNVar7->namespaceUri).m_pos = local_40.m_pos;
    this->initialTagStackStringStorageSize = this->tagStackStringStorageSize;
    this->tagsDone = false;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      return;
    }
  }
LAB_003a0711:
  __stack_chk_fail();
}

Assistant:

QXmlStreamPrivateTagStack::QXmlStreamPrivateTagStack()
{
    tagStack.reserve(16);
    tagStackStringStorage.reserve(32);
    tagStackStringStorageSize = 0;
    NamespaceDeclaration &namespaceDeclaration = namespaceDeclarations.push();
    namespaceDeclaration.prefix = addToStringStorage(u"xml");
    namespaceDeclaration.namespaceUri = addToStringStorage(u"http://www.w3.org/XML/1998/namespace");
    initialTagStackStringStorageSize = tagStackStringStorageSize;
    tagsDone = false;
}